

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_first<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  example *peVar1;
  ulong uVar2;
  long lVar3;
  action_score *paVar4;
  ulong uVar5;
  size_t sVar6;
  
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar1 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar4 = (peVar1->pred).a_s._begin;
  uVar5 = (long)(peVar1->pred).scalars._end - (long)paVar4 >> 3;
  sVar6 = data->tau;
  if (sVar6 == 0) {
    if (1 < (uVar5 & 0xffffffff)) {
      lVar3 = 0;
      do {
        (peVar1->pred).scalars._begin[lVar3 * 2 + 3] = 0.0;
        lVar3 = lVar3 + 1;
      } while ((uVar5 & 0xffffffff) - 1 != lVar3);
      paVar4 = (peVar1->pred).a_s._begin;
    }
    paVar4->score = 1.0;
  }
  else {
    if ((uVar5 & 0xffffffff) != 0) {
      uVar2 = 0;
      do {
        (peVar1->pred).a_s._begin[uVar2].score = 1.0 / (float)(uVar5 & 0xffffffff);
        uVar2 = uVar2 + 1;
      } while ((uVar5 & 0xffffffff) != uVar2);
      sVar6 = data->tau;
    }
    data->tau = sVar6 - 1;
  }
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(data->epsilon,1);
  return;
}

Assistant:

void predict_or_learn_first(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Explore tau times, then act according to optimal.
  if (is_learn && data.gen_cs.known_cost.probability < 1 && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<true>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();

  if (data.tau)
  {
    float prob = 1.f / (float)num_actions;
    for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
    data.tau--;
  }
  else
  {
    for (size_t i = 1; i < num_actions; i++) preds[i].score = 0.;
    preds[0].score = 1.0;
  }

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}